

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# suffixtree.cpp
# Opt level: O0

void __thiscall
SuffixTree::GeneralizedSuffixTree::BuildSuffixTreeFromFile
          (GeneralizedSuffixTree *this,string *filename)

{
  char symbol_00;
  bool bVar1;
  uint letter_00;
  char *pcVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__;
  size_t sVar3;
  Node *pNVar4;
  size_type sVar5;
  ulong uVar6;
  reference pvVar7;
  float local_4ec;
  Node *node;
  Node *old_active_node;
  Node *last_inserted_node;
  uint letter;
  uint uStack_488;
  char symbol;
  uint j;
  uint i;
  int local_460;
  uint local_45c;
  uint len;
  uint symbols_num;
  char strbuf [1024];
  allocator<char> local_41;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  FILE *local_20;
  FILE *file;
  string *filename_local;
  GeneralizedSuffixTree *this_local;
  
  file = (FILE *)filename;
  filename_local = (string *)this;
  printf("Loading strings...\n");
  pcVar2 = (char *)std::__cxx11::string::c_str();
  local_20 = fopen(pcVar2,"r");
  if (local_20 == (FILE *)0x0) {
    strbuf[0x3fb] = '\x01';
    __return_storage_ptr__ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         __cxa_allocate_exception(0x20);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"Can not open file: ",&local_41);
    std::operator+(__return_storage_ptr__,&local_40,filename);
    strbuf[0x3fb] = '\0';
    __cxa_throw(__return_storage_ptr__,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string
               );
  }
  local_45c = 0;
  while (pcVar2 = fgets((char *)&len,0x400,local_20), pcVar2 != (char *)0x0) {
    sVar3 = strlen((char *)&len);
    local_460 = (int)sVar3;
    if (local_460 != 0) {
      *(undefined1 *)((long)&len + (ulong)(local_460 - 1)) = 0;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&i,(char *)&len,(allocator<char> *)((long)&j + 3));
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&this->strings,(value_type *)&i);
      std::__cxx11::string::~string((string *)&i);
      std::allocator<char>::~allocator((allocator<char> *)((long)&j + 3));
      local_45c = local_460 + local_45c;
    }
  }
  fclose(local_20);
  printf("\r\rStrings were loaded successfully\n");
  if (local_45c == 0) {
    pcVar2 = (char *)malloc(0x60);
    this->nodes = pcVar2;
    pcVar2 = (char *)malloc(0x10);
    this->leaves = pcVar2;
  }
  else {
    pcVar2 = (char *)malloc((ulong)local_45c * 0x60);
    this->nodes = pcVar2;
    pcVar2 = (char *)malloc((ulong)local_45c << 4);
    this->leaves = pcVar2;
  }
  pNVar4 = AllocNode(this,(Node *)0x0,(Node *)0x0);
  this->root = pNVar4;
  this->root->suffix_link = this->root;
  this->active_node = this->root;
  this->active_edge = 0;
  this->active_length = 0;
  this->remainder = 0;
  uStack_488 = 0;
  do {
    sVar5 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(&this->strings);
    if (sVar5 <= uStack_488) {
      printf("\rTree was built successfully\n");
      return;
    }
    sVar5 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(&this->strings);
    local_4ec = (float)sVar5;
    printf("\rBuilding tree: %.2f %%",(double)(((float)uStack_488 * 100.0) / local_4ec));
    letter = 0;
    while( true ) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[](&this->strings,(ulong)uStack_488);
      uVar6 = std::__cxx11::string::size();
      if (uVar6 < letter) break;
      pvVar7 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](&this->strings,(ulong)uStack_488);
      pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)pvVar7);
      symbol_00 = *pcVar2;
      letter_00 = MakeLetter(symbol_00,uStack_488);
      old_active_node = (Node *)0x0;
      this->remainder = this->remainder + 1;
      while (this->remainder != 0) {
        pNVar4 = this->active_node;
        bVar1 = AddSymbol(this,symbol_00);
        if (bVar1) {
          if (old_active_node != (Node *)0x0) {
            old_active_node->suffix_link = pNVar4;
          }
          break;
        }
        if (this->active_length == 0) {
          InsertLeaf(this,letter_00,uStack_488,letter);
          if (old_active_node != (Node *)0x0) {
            old_active_node->suffix_link = this->active_node;
          }
          pNVar4 = this->active_node;
        }
        else {
          pNVar4 = InsertNode(this,letter_00,uStack_488,letter);
          if (old_active_node != (Node *)0x0) {
            old_active_node->suffix_link = pNVar4;
          }
        }
        old_active_node = pNVar4;
        if (this->active_node == this->root) {
          if (this->active_length != 0) {
            this->active_length = this->active_length - 1;
            Move(this,uStack_488,letter - this->active_length);
          }
        }
        else {
          this->active_node = this->active_node->suffix_link;
          if (this->active_length != 0) {
            Move(this,uStack_488,letter - this->active_length);
          }
        }
        this->remainder = this->remainder - 1;
      }
      letter = letter + 1;
    }
    uStack_488 = uStack_488 + 1;
  } while( true );
}

Assistant:

void GeneralizedSuffixTree::BuildSuffixTreeFromFile (std::string filename)
{
    // load strings from file
    printf ("Loading strings...\n");
    FILE *file = fopen (filename.c_str(), "r");
    if (!file)
        throw std::string ("Can not open file: ") + filename;
    char strbuf[1024];
    uint symbols_num = 0;
    while (fgets (strbuf, 1024, file))
    {
        uint len = strlen (strbuf);
        if (len > 0)
        {
            strbuf[len - 1] = '\0';
            strings.push_back (strbuf);
            symbols_num += len;
        }
    }
    fclose (file);
    printf ("\r\rStrings were loaded successfully\n");
    // allocate space for nodes and leaves
	if (symbols_num)
	{
		nodes = static_cast<char *> (malloc (symbols_num * sizeof (Node)));
		leaves = static_cast<char *> (malloc (symbols_num * sizeof (Leaf)));
	}
    else
	{
		nodes = static_cast<char *> (malloc (sizeof (Node)));
		leaves = static_cast<char *> (malloc (sizeof (Leaf)));
	}
    // build tree
    root = AllocNode (nullptr, nullptr);
    root->suffix_link = root;
    active_node = root;
    active_edge = 0;
    active_length = 0;
    remainder = 0;
    for (uint i = 0; i < strings.size(); ++i)
    {
        printf ("\rBuilding tree: %.2f %%", i * 100.0f / strings.size());
        for (uint j = 0; j <= strings[i].size(); ++j)
        {
            char symbol = strings[i][j];
            uint letter = MakeLetter (symbol, i);
            Node *last_inserted_node = nullptr;
            ++remainder;
            while (remainder)
            {
                // try add symbol
                Node *old_active_node = active_node;
                if (AddSymbol (symbol))
                {
                    if (last_inserted_node)
                        last_inserted_node->suffix_link = old_active_node;
                    break;
                }
                // insert node or leaf
                if (active_length)
                {
                    // insert node
                    Node *node = InsertNode (letter, i, j);
                    if (last_inserted_node)
                        last_inserted_node->suffix_link = node;
                    last_inserted_node = node;
                }
                else
                {
                    // insert leaf
                    InsertLeaf (letter, i, j);
                    if (last_inserted_node)
                        last_inserted_node->suffix_link = active_node;
                    last_inserted_node = active_node;
                }
                // move to next active point
                if (active_node != root)
                {
                    active_node = active_node->suffix_link;
                    if (active_length)
                        Move (i, j - active_length);
                }
                else if (active_length)
                {
                    --active_length;
                    Move (i, j - active_length);
                }
                --remainder;
            }
        }
    }
    printf ("\rTree was built successfully\n");
}